

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

int __thiscall
fasttext::AutotuneStrategy::getIndex
          (AutotuneStrategy *this,int val,vector<int,_std::allocator<int>_> *choices)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar1;
  const_iterator __first_00;
  const_iterator __last;
  difference_type dVar2;
  int ind;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> found;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffb0
  ;
  int *in_stack_ffffffffffffffb8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
  __first._M_current._4_4_ = in_stack_ffffffffffffffcc;
  __first._M_current._0_4_ = in_stack_ffffffffffffffc8;
  std::find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
            (__first,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  iVar3 = 0;
  __first_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffffb0,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffffa8);
  if (bVar1) {
    __last = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8);
    dVar2 = std::
            distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                       __first_00._M_current,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                       __last._M_current);
    iVar3 = (int)dVar2;
  }
  return iVar3;
}

Assistant:

int AutotuneStrategy::getIndex(int val, const std::vector<int>& choices) {
  auto found = std::find(choices.begin(), choices.end(), val);
  int ind = 0;
  if (found != choices.end()) {
    ind = std::distance(choices.begin(), found);
  }
  return ind;
}